

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O0

void __thiscall
TEST_TestRegistry_runTwoTestsCheckResultFunctionsCalled_Test::
TEST_TestRegistry_runTwoTestsCheckResultFunctionsCalled_Test
          (TEST_TestRegistry_runTwoTestsCheckResultFunctionsCalled_Test *this)

{
  TEST_TestRegistry_runTwoTestsCheckResultFunctionsCalled_Test *this_local;
  
  memset(this,0,0x48);
  TEST_GROUP_CppUTestGroupTestRegistry::TEST_GROUP_CppUTestGroupTestRegistry
            (&this->super_TEST_GROUP_CppUTestGroupTestRegistry);
  (this->super_TEST_GROUP_CppUTestGroupTestRegistry).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_TestRegistry_runTwoTestsCheckResultFunctionsCalled_Test_003fdda0;
  return;
}

Assistant:

TEST(TestRegistry, runTwoTestsCheckResultFunctionsCalled)
{
    myRegistry->addTest(test1);
    myRegistry->addTest(test2);
    myRegistry->runAllTests(*result);
    LONGS_EQUAL(1, mockResult->countTestsStarted);
    LONGS_EQUAL(1, mockResult->countTestsEnded);
    LONGS_EQUAL(1, mockResult->countCurrentGroupStarted);
    LONGS_EQUAL(1, mockResult->countCurrentGroupEnded);
    LONGS_EQUAL(2, mockResult->countCurrentTestStarted);
    LONGS_EQUAL(2, mockResult->countCurrentTestEnded);
}